

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsBool helicsCoreWaitForDisconnect(HelicsCore core,int msToWait,HelicsError *err)

{
  uint uVar1;
  Core *pCVar2;
  
  pCVar2 = getCore(core,err);
  if (pCVar2 == (Core *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (*pCVar2->_vptr_Core[10])(pCVar2,(long)msToWait);
    uVar1 = uVar1 & 0xff;
  }
  return uVar1;
}

Assistant:

HelicsBool helicsCoreWaitForDisconnect(HelicsCore core, int msToWait, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return HELICS_TRUE;
    }
    try {
        const bool res = cppcore->waitForDisconnect(std::chrono::milliseconds(msToWait));
        return res ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}